

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb18030.c
# Opt level: O0

int gb18030_code_to_mbclen(OnigCodePoint code)

{
  char c;
  OnigCodePoint code_local;
  
  if ((code & 0xff000000) == 0) {
    if ((code & 0xff0000) != 0) {
      return -400;
    }
    if ((code & 0xff00) == 0) {
      if (""[(int)(code & 0xff)] != '\x03') {
        return 1;
      }
    }
    else if ((""[(int)(code >> 8 & 0xff)] == '\x03') &&
            ((""[(int)(code & 0xff)] == '\x03' || (""[(int)(code & 0xff)] == '\x01')))) {
      return 2;
    }
  }
  else if ((""[(int)(code >> 0x18)] == '\x03') && (""[(int)(code >> 0x10 & 0xff)] == '\x02')) {
    return 4;
  }
  return -400;
}

Assistant:

static int
gb18030_code_to_mbclen(OnigCodePoint code)
{
  if ((code & 0xff000000) != 0) {
    if (GB18030_MAP[(int )(code >> 24) & 0xff] == CM)
      if (GB18030_MAP[(int )(code >> 16) & 0xff] == C4)
        return 4;
  }
  else if ((code & 0xff0000) != 0) return ONIGERR_INVALID_CODE_POINT_VALUE;
  else if ((code & 0xff00) != 0) {
    if (GB18030_MAP[(int )(code >> 8) & 0xff] == CM) {
      char c = GB18030_MAP[(int )code & 0xff];
      if (c == CM || c == C2)
        return 2;
    }
  }
  else {
    if (GB18030_MAP[(int )(code & 0xff)] != CM)
      return 1;
  }

  return ONIGERR_INVALID_CODE_POINT_VALUE;
}